

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPMacAlgorithm::signUpdate(OSSLEVPMacAlgorithm *this,ByteString *dataToSign)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *data;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  ByteString dummy;
  ByteString *in_stack_ffffffffffffff88;
  ByteString local_40;
  byte local_1;
  
  bVar1 = MacAlgorithm::signUpdate(in_RDI,in_RSI);
  if (bVar1) {
    sVar3 = ByteString::size((ByteString *)0x1ba01a);
    if (sVar3 == 0) {
      local_1 = 1;
    }
    else {
      ctx = (HMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
      data = ByteString::const_byte_str(in_stack_ffffffffffffff88);
      sVar3 = ByteString::size((ByteString *)0x1ba051);
      iVar2 = HMAC_Update(ctx,data,sVar3);
      if (iVar2 == 0) {
        softHSMLog(3,"signUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                   ,0x5c,"HMAC_Update failed");
        HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
        in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
        ByteString::ByteString((ByteString *)0x1ba0bc);
        MacAlgorithm::signFinal(in_RDI,&local_40);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1ba0dc);
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPMacAlgorithm::signUpdate(const ByteString& dataToSign)
{
	if (!MacAlgorithm::signUpdate(dataToSign))
	{
		return false;
	}

	// The GOST implementation in OpenSSL will segfault if we update with zero length.
	if (dataToSign.size() == 0) return true;

	if (!HMAC_Update(curCTX, dataToSign.const_byte_str(), dataToSign.size()))
	{
		ERROR_MSG("HMAC_Update failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}